

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler.cpp
# Opt level: O1

Vector3D * __thiscall
CGL::UniformHemisphereSampler3D::get_sample
          (Vector3D *__return_storage_ptr__,UniformHemisphereSampler3D *this)

{
  undefined1 auVar1 [16];
  result_type rVar2;
  result_type rVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  double dVar9;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 local_58 [16];
  
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)minstd_engine);
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)minstd_engine);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = rVar2;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = rVar3;
  auVar11 = vpunpcklqdq_avx(auVar11,auVar10);
  auVar10 = vpblendd_avx2(auVar11,(undefined1  [16])0x0,10);
  auVar16._8_8_ = 0x4330000000000000;
  auVar16._0_8_ = 0x4330000000000000;
  auVar10 = vpor_avx(auVar10,auVar16);
  auVar11 = vpsrlq_avx(auVar11,0x20);
  auVar17._8_8_ = 0x4530000000000000;
  auVar17._0_8_ = 0x4530000000000000;
  auVar11 = vpor_avx(auVar11,auVar17);
  auVar18._8_8_ = 0x4530000000100000;
  auVar18._0_8_ = 0x4530000000100000;
  auVar11 = vsubpd_avx(auVar11,auVar18);
  auVar12._0_8_ = (auVar10._0_8_ + auVar11._0_8_) * 2.3283064370807974e-10;
  auVar12._8_8_ = (auVar10._8_8_ + auVar11._8_8_) * 2.3283064370807974e-10;
  auVar14._8_8_ = 0x3e7ad7f29abcaf48;
  auVar14._0_8_ = 0x3e7ad7f29abcaf48;
  auVar11 = vmaxpd_avx(auVar14,auVar12);
  auVar13._8_8_ = 0x3feffffffaa19c47;
  auVar13._0_8_ = 0x3feffffffaa19c47;
  auVar10 = vcmppd_avx(auVar13,auVar11,1);
  uVar4 = vmovmskpd_avx(auVar10);
  if ((uVar4 & 2) == 0) {
    auVar10 = vshufpd_avx(auVar11,auVar11,1);
    dVar9 = auVar10._0_8_;
  }
  else {
    dVar9 = 0.99999999;
  }
  dVar9 = acos(dVar9);
  fVar5 = (float)dVar9;
  fVar6 = sinf(fVar5);
  if ((uVar4 & 1) == 0) {
    local_58._0_8_ = auVar11._0_8_;
    fVar7 = (float)((double)local_58._0_8_ * 6.283185307179586);
  }
  else {
    fVar7 = 6.2831855;
  }
  local_58._0_4_ = cosf(fVar7);
  local_58._4_4_ = extraout_XMM0_Db_00;
  local_58._8_4_ = extraout_XMM0_Dc_00;
  local_58._12_4_ = extraout_XMM0_Dd_00;
  fVar8 = sinf(fVar5);
  fVar7 = sinf(fVar7);
  fVar5 = cosf(fVar5);
  auVar1._4_4_ = extraout_XMM0_Db;
  auVar1._0_4_ = fVar6;
  auVar1._8_4_ = extraout_XMM0_Dc;
  auVar1._12_4_ = extraout_XMM0_Dd;
  auVar10 = vinsertps_avx(auVar1,ZEXT416((uint)fVar8),0x10);
  auVar11 = vinsertps_avx(local_58,ZEXT416((uint)fVar7),0x10);
  auVar15._0_4_ = auVar10._0_4_ * auVar11._0_4_;
  auVar15._4_4_ = auVar10._4_4_ * auVar11._4_4_;
  auVar15._8_4_ = auVar10._8_4_ * auVar11._8_4_;
  auVar15._12_4_ = auVar10._12_4_ * auVar11._12_4_;
  auVar10 = vcvtps2pd_avx(auVar15);
  *(undefined1 (*) [16])(__return_storage_ptr__->field_0).field_2.__vec = auVar10;
  (__return_storage_ptr__->field_0).field_0.z = (double)fVar5;
  return __return_storage_ptr__;
}

Assistant:

Vector3D UniformHemisphereSampler3D::get_sample() const {

  double Xi1 = random_uniform();
  double Xi2 = random_uniform();

  double theta = acos(Xi1);
  double phi = 2.0 * PI * Xi2;

  double xs = sinf(theta) * cosf(phi);
  double ys = sinf(theta) * sinf(phi);
  double zs = cosf(theta);

  return Vector3D(xs, ys, zs);

}